

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::MDLImporter::ProcessFrames_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSharedData_MDL7 *shared,uchar *szCurrent,uchar **szCurrentOut)

{
  ushort uVar1;
  ushort uVar2;
  uchar *puVar3;
  pointer paVar4;
  Logger *pLVar5;
  ulong uVar6;
  Triangle_MDL7 *pTVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Frame_MDL7 *pFVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  aiVector3D vNormal;
  IntFrameInfo_MDL7 frame;
  aiVector3D local_9c;
  Frame_MDL7 *local_90;
  MDLImporter *local_88;
  float local_7c;
  float local_78;
  float local_74;
  IntSharedData_MDL7 *local_70;
  uchar **local_68;
  ulong local_60;
  ulong local_58;
  uchar *local_50;
  ulong local_48;
  IntFrameInfo_MDL7 local_40;
  
  local_88 = this;
  if (szCurrent == (uchar *)0x0) {
    __assert_fail("nullptr != szCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x46a,
                  "bool Assimp::MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7 &, MDL::IntGroupData_MDL7 &, MDL::IntSharedData_MDL7 &, const unsigned char *, const unsigned char **)"
                 );
  }
  if (szCurrentOut == (uchar **)0x0) {
    __assert_fail("nullptr != szCurrentOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x46b,
                  "bool Assimp::MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7 &, MDL::IntGroupData_MDL7 &, MDL::IntSharedData_MDL7 &, const unsigned char *, const unsigned char **)"
                 );
  }
  bVar14 = groupInfo->pcGroup->numframes == 0;
  if (!bVar14) {
    puVar3 = this->mBuffer;
    local_48 = 0;
    local_70 = shared;
    local_68 = szCurrentOut;
    do {
      local_40.iIndex = (uint)local_48;
      uVar1 = *(ushort *)(puVar3 + 0x2e);
      local_60 = (ulong)((uint)*(ushort *)(puVar3 + 0x2c) *
                         ((Frame_MDL7 *)szCurrent)->transmatrix_count +
                        (uint)*(ushort *)(puVar3 + 0x2a) * ((Frame_MDL7 *)szCurrent)->vertices_count
                        + (uint)uVar1);
      local_50 = (uchar *)((long)szCurrent + (local_60 - (long)puVar3));
      local_58 = (ulong)*(uint *)(puVar3 + 0x10);
      local_90 = (Frame_MDL7 *)szCurrent;
      local_40.pcFrame = (Frame_MDL7 *)szCurrent;
      if ((long)local_58 < (long)local_50) {
        pLVar5 = DefaultLogger::get();
        Logger::warn(pLVar5,
                     "Index overflow in frame area. Ignoring all frames and all further mesh groups, too."
                    );
        *szCurrentOut = (uchar *)local_90;
      }
      else {
        pFVar12 = (Frame_MDL7 *)szCurrent;
        if ((local_88->configFrameID == local_40.iIndex) &&
           (((Frame_MDL7 *)szCurrent)->vertices_count != 0)) {
          uVar9 = 0;
          do {
            uVar6 = (ulong)(*(ushort *)(puVar3 + 0x2a) * uVar9);
            uVar2 = *(ushort *)(((Frame_MDL7 *)szCurrent)->frame_name + uVar6 + (ulong)uVar1 + 0xc);
            if ((int)(uint)uVar2 < groupInfo->pcGroup->numverts) {
              local_9c.x = 0.0;
              local_9c.y = 0.0;
              local_9c.z = 0.0;
              fVar15 = *(float *)(((Frame_MDL7 *)szCurrent)->frame_name + uVar6 + uVar1);
              fVar16 = *(float *)(((Frame_MDL7 *)szCurrent)->frame_name + uVar6 + (ulong)uVar1 + 4);
              fVar17 = *(float *)(((Frame_MDL7 *)szCurrent)->frame_name + uVar6 + (ulong)uVar1 + 8);
              if (*(ushort *)(puVar3 + 0x28) < 0x1a) {
                if (0xf < *(ushort *)(puVar3 + 0x28)) {
                  local_7c = fVar17;
                  local_78 = fVar16;
                  local_74 = fVar15;
                  MD2::LookupNormalIndex
                            (((Frame_MDL7 *)szCurrent)->frame_name[uVar6 + (ulong)uVar1 + 0xe],
                             &local_9c);
                  pFVar12 = local_90;
                  fVar15 = local_74;
                  fVar16 = local_78;
                  fVar17 = local_7c;
                }
              }
              else {
                local_9c.y = *(float *)(((Frame_MDL7 *)szCurrent)->frame_name +
                                       uVar6 + (ulong)uVar1 + 0x12);
                local_9c.x = *(float *)(((Frame_MDL7 *)szCurrent)->frame_name +
                                       uVar6 + (ulong)uVar1 + 0xe);
                local_9c.z = *(float *)(((Frame_MDL7 *)szCurrent)->frame_name +
                                       uVar6 + (ulong)uVar1 + 0x16);
              }
              if (groupInfo->pcGroup->numtris != 0) {
                pTVar7 = groupInfo->pcGroupTris;
                uVar8 = 0;
                uVar6 = 0;
                do {
                  lVar10 = 0;
                  do {
                    if (pTVar7->v_index[lVar10] == uVar2) {
                      uVar11 = uVar6 + lVar10 & 0xffffffff;
                      paVar4 = (groupData->vPositions).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      paVar4[uVar11].x = fVar15;
                      paVar4[uVar11].y = fVar16;
                      paVar4[uVar11].z = fVar17;
                      paVar4 = (groupData->vNormals).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      paVar4[uVar11].z = local_9c.z;
                      paVar4 = paVar4 + uVar11;
                      paVar4->x = local_9c.x;
                      paVar4->y = local_9c.y;
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  pTVar7 = (Triangle_MDL7 *)
                           ((long)pTVar7->v_index + (ulong)*(ushort *)(puVar3 + 0x26));
                  uVar8 = uVar8 + 1;
                  uVar6 = (ulong)((int)uVar6 + 3);
                } while (uVar8 < (uint)groupInfo->pcGroup->numtris);
              }
            }
            else {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,"Invalid vertex index in frame vertex section");
              pFVar12 = local_90;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < pFVar12->vertices_count);
        }
        if (local_70->apcOutBones != (IntBone_MDL7 **)0x0) {
          ParseBoneTrafoKeys_3DGS_MDL7(local_88,groupInfo,&local_40,local_70);
          pFVar12 = local_90;
        }
        local_90 = (Frame_MDL7 *)(pFVar12->frame_name + local_60);
        szCurrentOut = local_68;
      }
      szCurrent = (uchar *)local_90;
      if ((long)local_58 < (long)local_50) break;
      uVar9 = (int)local_48 + 1;
      local_48 = (ulong)uVar9;
      bVar13 = uVar9 < (uint)groupInfo->pcGroup->numframes;
      bVar14 = !bVar13;
    } while (bVar13);
  }
  if (bVar14 != false) {
    *szCurrentOut = szCurrent;
  }
  return bVar14;
}

Assistant:

bool MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7& groupInfo,
    MDL::IntGroupData_MDL7&  groupData,
    MDL::IntSharedData_MDL7& shared,
    const unsigned char*     szCurrent,
    const unsigned char**    szCurrentOut)
{
    ai_assert( nullptr != szCurrent );
    ai_assert( nullptr != szCurrentOut);

    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)mBuffer;

    // if we have no bones we can simply skip all frames,
    // otherwise we'll need to process them.
    // FIX: If we need another frame than the first we must apply frame vertex replacements ...
    for(unsigned int iFrame = 0; iFrame < (unsigned int)groupInfo.pcGroup->numframes;++iFrame)  {
        MDL::IntFrameInfo_MDL7 frame ((BE_NCONST MDL::Frame_MDL7*)szCurrent,iFrame);

        AI_SWAP4(frame.pcFrame->vertices_count);
        AI_SWAP4(frame.pcFrame->transmatrix_count);

        const unsigned int iAdd = pcHeader->frame_stc_size +
            frame.pcFrame->vertices_count * pcHeader->framevertex_stc_size +
            frame.pcFrame->transmatrix_count * pcHeader->bonetrans_stc_size;

        if (((const char*)szCurrent - (const char*)pcHeader) + iAdd > (unsigned int)pcHeader->data_size)    {
            ASSIMP_LOG_WARN("Index overflow in frame area. "
                "Ignoring all frames and all further mesh groups, too.");

            // don't parse more groups if we can't even read one
            // FIXME: sometimes this seems to occur even for valid files ...
            *szCurrentOut = szCurrent;
            return false;
        }
        // our output frame?
        if (configFrameID == iFrame)    {
            BE_NCONST MDL::Vertex_MDL7* pcFrameVertices = (BE_NCONST MDL::Vertex_MDL7*)(szCurrent+pcHeader->frame_stc_size);

            for (unsigned int qq = 0; qq < frame.pcFrame->vertices_count;++qq)  {
                // I assume this are simple replacements for normal vertices, the bone index serving
                // as the index of the vertex to be replaced.
                uint16_t iIndex = _AI_MDL7_ACCESS(pcFrameVertices,qq,pcHeader->framevertex_stc_size,MDL::Vertex_MDL7).vertindex;
                AI_SWAP2(iIndex);
                if (iIndex >= groupInfo.pcGroup->numverts)  {
                    ASSIMP_LOG_WARN("Invalid vertex index in frame vertex section");
                    continue;
                }

                aiVector3D vPosition,vNormal;

                vPosition.x = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .x;
                AI_SWAP4(vPosition.x);
                vPosition.y = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .y;
                AI_SWAP4(vPosition.y);
                vPosition.z = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .z;
                AI_SWAP4(vPosition.z);

                // now read the normal vector
                if (AI_MDL7_FRAMEVERTEX030305_STCSIZE <= pcHeader->mainvertex_stc_size) {
                    // read the full normal vector
                    vNormal.x = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[0];
                    AI_SWAP4(vNormal.x);
                    vNormal.y = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[1];
                    AI_SWAP4(vNormal.y);
                    vNormal.z = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[2];
                    AI_SWAP4(vNormal.z);
                }
                else if (AI_MDL7_FRAMEVERTEX120503_STCSIZE <= pcHeader->mainvertex_stc_size)    {
                    // read the normal vector from Quake2's smart table
                    MD2::LookupNormalIndex(_AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,
                        pcHeader->framevertex_stc_size) .norm162index,vNormal);
                }

                // FIXME: O(n^2) at the moment ...
                BE_NCONST MDL::Triangle_MDL7* pcGroupTris = groupInfo.pcGroupTris;
                unsigned int iOutIndex = 0;
                for (unsigned int iTriangle = 0; iTriangle < (unsigned int)groupInfo.pcGroup->numtris; ++iTriangle) {
                    // iterate through all indices of the current triangle
                    for (unsigned int c = 0; c < 3;++c,++iOutIndex) {
                        // replace the vertex with the new data
                        const unsigned int iCurIndex = pcGroupTris->v_index[c];
                        if (iCurIndex == iIndex)    {
                            groupData.vPositions[iOutIndex] = vPosition;
                            groupData.vNormals[iOutIndex] = vNormal;
                        }
                    }
                    // get the next triangle in the list
                    pcGroupTris = (BE_NCONST MDL::Triangle_MDL7*)((const char*)
                        pcGroupTris + pcHeader->triangle_stc_size);
                }
            }
        }
        // parse bone trafo matrix keys (only if there are bones ...)
        if (shared.apcOutBones) {
            ParseBoneTrafoKeys_3DGS_MDL7(groupInfo,frame,shared);
        }
        szCurrent += iAdd;
    }
    *szCurrentOut = szCurrent;
    return true;
}